

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *outPrefix,
          string *outBase,string *outSuffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  string *psVar5;
  string *psVar6;
  bool bVar7;
  char *pcVar8;
  _Alloc_hider __s;
  char *pcVar9;
  char *__s_00;
  LinkClosure *pLVar10;
  long *plVar11;
  size_t sVar12;
  size_type *psVar13;
  ulong *puVar14;
  ArtifactType artifact_00;
  string fw_prefix;
  string ll;
  size_type __dnew_1;
  string local_e0;
  string local_c0;
  string local_a0;
  char *local_80;
  string *local_78;
  string *local_70;
  undefined2 *local_68;
  undefined8 local_60;
  undefined2 local_58;
  undefined6 uStack_56;
  ArtifactType local_48;
  ArtifactType local_44;
  string *local_40;
  string *local_38;
  
  TVar2 = this->Target->TargetTypeValue;
  if (MODULE_LIBRARY < TVar2) {
    std::__cxx11::string::_M_replace
              ((ulong)outPrefix,0,(char *)outPrefix->_M_string_length,0x66eafa);
    std::__cxx11::string::_M_assign((string *)outBase);
    std::__cxx11::string::_M_replace
              ((ulong)outSuffix,0,(char *)outSuffix->_M_string_length,0x66eafa);
    return;
  }
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_78 = outBase;
  local_70 = config;
  local_48 = artifact;
  local_40 = outPrefix;
  local_38 = outSuffix;
  if (artifact == ImportLibraryArtifact) {
    pcVar3 = this->Makefile;
    local_e0._M_dataplus._M_p = (pointer)0x1b;
    local_c0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_e0);
    local_c0.field_2._M_allocated_capacity._0_4_ = SUB84(local_e0._M_dataplus._M_p,0);
    local_c0.field_2._M_local_buf[4] = (char)((ulong)local_e0._M_dataplus._M_p >> 0x20);
    local_c0.field_2._M_local_buf[5] = (char)((ulong)local_e0._M_dataplus._M_p >> 0x28);
    local_c0.field_2._M_local_buf[6] = (char)((ulong)local_e0._M_dataplus._M_p >> 0x30);
    local_c0.field_2._M_local_buf[7] = (char)((ulong)local_e0._M_dataplus._M_p >> 0x38);
    builtin_strncpy(local_c0._M_dataplus._M_p,"CMAKE_IMPORT_LIBRARY_SUFFIX",0x1b);
    local_c0._M_string_length = (size_type)local_e0._M_dataplus._M_p;
    local_c0._M_dataplus._M_p[(long)local_e0._M_dataplus._M_p] = '\0';
    pcVar8 = cmMakefile::GetDefinition(pcVar3,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT17(local_c0.field_2._M_local_buf[7],
                               CONCAT16(local_c0.field_2._M_local_buf[6],
                                        CONCAT15(local_c0.field_2._M_local_buf[5],
                                                 CONCAT14(local_c0.field_2._M_local_buf[4],
                                                          local_c0.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
    if (pcVar8 == (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)outPrefix,0,(char *)outPrefix->_M_string_length,0x66eafa);
      std::__cxx11::string::_M_replace
                ((ulong)local_78,0,(char *)local_78->_M_string_length,0x66eafa);
      std::__cxx11::string::_M_replace
                ((ulong)local_38,0,(char *)local_38->_M_string_length,0x66eafa);
      return;
    }
    TVar2 = this->Target->TargetTypeValue;
    local_c0.field_2._M_allocated_capacity._0_4_ = 0x4f504d49;
    local_c0.field_2._M_local_buf[4] = 'R';
    local_c0.field_2._M_local_buf[5] = 'T';
    local_c0.field_2._M_local_buf[6] = '_';
    local_c0.field_2._M_local_buf[7] = 'P';
    local_c0.field_2._8_5_ = 0x5849464552;
    local_c0._M_string_length = 0xd;
    local_c0.field_2._M_local_buf[0xd] = '\0';
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    __s._M_p = GetProperty(this,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT17(local_c0.field_2._M_local_buf[7],
                               CONCAT16(local_c0.field_2._M_local_buf[6],
                                        CONCAT15(local_c0.field_2._M_local_buf[5],
                                                 CONCAT14(local_c0.field_2._M_local_buf[4],
                                                          local_c0.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
    local_c0.field_2._M_allocated_capacity._0_4_ = 0x4f504d49;
    local_c0.field_2._M_local_buf[4] = 'R';
    local_c0.field_2._M_local_buf[5] = 'T';
    local_c0.field_2._M_local_buf[6] = '_';
    local_c0.field_2._M_local_buf[7] = 'S';
    local_c0.field_2._8_5_ = 0x5849464655;
    local_c0._M_string_length = 0xd;
    local_c0.field_2._M_local_buf[0xd] = '\0';
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    pcVar8 = GetProperty(this,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT17(local_c0.field_2._M_local_buf[7],
                               CONCAT16(local_c0.field_2._M_local_buf[6],
                                        CONCAT15(local_c0.field_2._M_local_buf[5],
                                                 CONCAT14(local_c0.field_2._M_local_buf[4],
                                                          local_c0.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
    artifact_00 = (ArtifactType)(TVar2 == EXECUTABLE || (TVar2 & ~STATIC_LIBRARY) == SHARED_LIBRARY)
    ;
  }
  else {
    artifact_00 = RuntimeBinaryArtifact;
    if (TVar2 != STATIC_LIBRARY) {
      artifact_00 = artifact;
    }
    local_c0.field_2._M_allocated_capacity._0_4_ = 0x46455250;
    local_c0.field_2._M_local_buf[4] = 'I';
    local_c0.field_2._M_local_buf[5] = 'X';
    local_c0._M_string_length = 6;
    local_c0.field_2._M_local_buf[6] = '\0';
    __s._M_p = GetProperty(this,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT17(local_c0.field_2._M_local_buf[7],
                               CONCAT16(local_c0.field_2._M_local_buf[6],
                                        CONCAT15(local_c0.field_2._M_local_buf[5],
                                                 CONCAT14(local_c0.field_2._M_local_buf[4],
                                                          local_c0.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
    local_c0.field_2._M_allocated_capacity._0_4_ = 0x46465553;
    local_c0.field_2._M_local_buf[4] = 'I';
    local_c0.field_2._M_local_buf[5] = 'X';
    local_c0._M_string_length = 6;
    local_c0.field_2._M_local_buf[6] = '\0';
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    pcVar8 = GetProperty(this,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT17(local_c0.field_2._M_local_buf[7],
                               CONCAT16(local_c0.field_2._M_local_buf[6],
                                        CONCAT15(local_c0.field_2._M_local_buf[5],
                                                 CONCAT14(local_c0.field_2._M_local_buf[4],
                                                          local_c0.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
  }
  if (local_70->_M_string_length == 0) {
    local_80 = (char *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase(&local_c0,local_70);
    std::__cxx11::string::append((char *)&local_c0);
    local_80 = GetProperty(this,&local_c0);
    if (((local_80 == (char *)0x0) || (bVar7 = IsAppBundleOnApple(this), bVar7)) ||
       (bVar7 = IsFrameworkOnApple(this), bVar7)) {
      local_80 = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT17(local_c0.field_2._M_local_buf[7],
                               CONCAT16(local_c0.field_2._M_local_buf[6],
                                        CONCAT15(local_c0.field_2._M_local_buf[5],
                                                 CONCAT14(local_c0.field_2._M_local_buf[4],
                                                          local_c0.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
  }
  pcVar9 = cmTarget::GetPrefixVariableInternal(this->Target,artifact_00);
  local_44 = artifact_00;
  __s_00 = cmTarget::GetSuffixVariableInternal(this->Target,artifact_00);
  pLVar10 = GetLinkClosure(this,local_70);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pcVar4 = (pLVar10->LinkerLanguage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar4,pcVar4 + (pLVar10->LinkerLanguage)._M_string_length);
  if (local_c0._M_string_length != 0) {
    if ((pcVar8 == (char *)0x0) && (__s_00 != (char *)0x0)) {
      if (*__s_00 == '\0') {
        pcVar8 = (char *)0x0;
      }
      else {
        local_68 = &local_58;
        local_58 = 0x5f;
        local_60 = 1;
        strlen(__s_00);
        plVar11 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_68,0,(char *)0x0,(ulong)__s_00);
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_a0.field_2._M_allocated_capacity = *psVar13;
          local_a0.field_2._8_8_ = plVar11[3];
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar13;
          local_a0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_a0._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
        puVar14 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_e0.field_2._M_allocated_capacity = *puVar14;
          local_e0.field_2._8_8_ = plVar11[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *puVar14;
          local_e0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_e0._M_string_length = plVar11[1];
        *plVar11 = (long)puVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_68 != &local_58) {
          operator_delete(local_68,CONCAT62(uStack_56,local_58) + 1);
        }
        pcVar8 = cmMakefile::GetDefinition(this->Makefile,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)__s._M_p ==
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) && (pcVar9 != (char *)0x0)) {
      if (*pcVar9 == '\0') {
        __s._M_p = (pointer)0x0;
      }
      else {
        local_68 = &local_58;
        local_58 = 0x5f;
        local_60 = 1;
        strlen(pcVar9);
        plVar11 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_68,0,(char *)0x0,(ulong)pcVar9);
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_a0.field_2._M_allocated_capacity = *psVar13;
          local_a0.field_2._8_8_ = plVar11[3];
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar13;
          local_a0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_a0._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
        puVar14 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_e0.field_2._M_allocated_capacity = *puVar14;
          local_e0.field_2._8_8_ = plVar11[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *puVar14;
          local_e0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_e0._M_string_length = plVar11[1];
        *plVar11 = (long)puVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_68 != &local_58) {
          operator_delete(local_68,CONCAT62(uStack_56,local_58) + 1);
        }
        __s._M_p = cmMakefile::GetDefinition(this->Makefile,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if ((pcVar9 != (char *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    pcVar3 = this->Makefile;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    sVar12 = strlen(pcVar9);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar9,pcVar9 + sVar12);
    __s._M_p = cmMakefile::GetSafeDefinition(pcVar3,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  psVar5 = local_70;
  if ((__s_00 != (char *)0x0) && (pcVar8 == (char *)0x0)) {
    pcVar3 = this->Makefile;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    sVar12 = strlen(__s_00);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,__s_00,__s_00 + sVar12);
    pcVar8 = cmMakefile::GetSafeDefinition(pcVar3,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_allocated_capacity =
       local_e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar7 = IsFrameworkOnApple(this);
  if (bVar7) {
    GetFrameworkDirectory(&local_a0,this,psVar5,ContentLevel);
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_e0);
    pcVar8 = (char *)0x0;
    __s._M_p = local_e0._M_dataplus._M_p;
  }
  bVar7 = IsCFBundleOnApple(this);
  if (bVar7) {
    GetCFBundleDirectory(&local_a0,this,psVar5,FullLevel);
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_e0);
    pcVar8 = (char *)0x0;
    __s._M_p = local_e0._M_dataplus._M_p;
  }
  psVar6 = local_40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    __s._M_p = "";
  }
  pcVar9 = (char *)local_40->_M_string_length;
  strlen(__s._M_p);
  std::__cxx11::string::_M_replace((ulong)psVar6,0,pcVar9,(ulong)__s._M_p);
  GetOutputName(&local_a0,this,psVar5,local_44);
  std::__cxx11::string::_M_append((char *)local_78,(ulong)local_a0._M_dataplus._M_p);
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_78);
  local_a0.field_2._M_allocated_capacity = 0x4f49535245564f53;
  local_a0.field_2._8_2_ = 0x4e;
  local_a0._M_string_length = 9;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  pcVar9 = GetProperty(this,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (((pcVar9 != (char *)0x0) && (local_48 != ImportLibraryArtifact)) &&
     (this->Target->TargetTypeValue == SHARED_LIBRARY)) {
    pcVar3 = this->Makefile;
    local_68 = (undefined2 *)0x26;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    local_a0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_a0,(ulong)&local_68);
    local_a0.field_2._M_allocated_capacity = (size_type)local_68;
    *(undefined8 *)((long)local_a0._M_dataplus._M_p + 0x10) = 0x4d414e5f59524152;
    *(undefined8 *)((long)local_a0._M_dataplus._M_p + 0x18) = 0x565f485449575f45;
    *(undefined8 *)local_a0._M_dataplus._M_p = 0x48535f454b414d43;
    *(undefined8 *)((long)local_a0._M_dataplus._M_p + 8) = 0x42494c5f44455241;
    builtin_strncpy((char *)((long)local_a0._M_dataplus._M_p + 0x1e),"_VERSION",8);
    local_a0._M_string_length = (size_type)local_68;
    local_a0._M_dataplus._M_p[(long)local_68] = '\0';
    bVar7 = cmMakefile::IsOn(pcVar3,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      std::__cxx11::string::append((char *)local_78);
      std::__cxx11::string::append((char *)local_78);
    }
  }
  psVar5 = local_38;
  pcVar9 = "";
  if (pcVar8 != (char *)0x0) {
    pcVar9 = pcVar8;
  }
  pcVar8 = (char *)local_38->_M_string_length;
  strlen(pcVar9);
  std::__cxx11::string::_M_replace((ulong)psVar5,0,pcVar8,(ulong)pcVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT16(local_c0.field_2._M_local_buf[6],
                                      CONCAT15(local_c0.field_2._M_local_buf[5],
                                               CONCAT14(local_c0.field_2._M_local_buf[4],
                                                        local_c0.field_2._M_allocated_capacity._0_4_
                                                       )))) + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  std::string& outPrefix, std::string& outBase, std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    outPrefix = "";
    outBase = this->GetName();
    outSuffix = "";
    return;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    outPrefix = "";
    outBase = "";
    outSuffix = "";
    return;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute the full name for main target types.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));
  const char* targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));
  const char* configPostfix = CM_NULLPTR;
  if (!config.empty()) {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if (configPostfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      configPostfix = CM_NULLPTR;
    }
  }
  const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
  const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    if (!targetSuffix && suffixVar && *suffixVar) {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
    }
    if (!targetPrefix && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }
  }

  // if there is no prefix on the target use the cmake definition
  if (!targetPrefix && prefixVar) {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar);
  }
  // if there is no suffix on the target use the cmake definition
  if (!targetSuffix && suffixVar) {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar);
  }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if (this->IsFrameworkOnApple()) {
    fw_prefix = this->GetFrameworkDirectory(config, ContentLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = CM_NULLPTR;
  }

  if (this->IsCFBundleOnApple()) {
    fw_prefix = this->GetCFBundleDirectory(config, FullLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = CM_NULLPTR;
  }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix ? targetPrefix : "";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, artifact);

  // Append the per-configuration postfix.
  outBase += configPostfix ? configPostfix : "";

  // Name shared libraries with their version number on some platforms.
  if (const char* soversion = this->GetProperty("SOVERSION")) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY &&
        !isImportedLibraryArtifact &&
        this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION")) {
      outBase += "-";
      outBase += soversion;
    }
  }

  // Append the suffix.
  outSuffix = targetSuffix ? targetSuffix : "";
}